

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ostream * Catch::clara::TextFlow::operator<<(ostream *os,Column *col)

{
  size_t sVar1;
  bool bVar2;
  string line;
  iterator __begin3;
  string local_80;
  iterator local_60;
  
  Column::iterator::iterator(&local_60,col);
  sVar1 = (long)(col->m_strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(col->m_strings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (((local_60.m_pos != 0) || (local_60.m_stringIndex != sVar1)) || (local_60.m_column != col)) {
    bVar2 = true;
    do {
      Column::iterator::operator*[abi_cxx11_(&local_80,&local_60);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>
                (os,local_80._M_dataplus._M_p,local_80._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      Column::iterator::operator++(&local_60);
    } while (((local_60.m_pos != 0) || (local_60.m_stringIndex != sVar1)) ||
            (local_60.m_column != col));
  }
  return os;
}

Assistant:

inline friend std::ostream& operator << (std::ostream& os, Column const& col) {
		bool first = true;
		for (auto line : col) {
			if (first)
				first = false;
			else
				os << "\n";
			os << line;
		}
		return os;
	}